

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeBidirectionalLSTMLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t val;
  uint64 uVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  LayerUnion LVar5;
  LSTMParams *pLVar6;
  ShapeRange *other;
  mapped_type *this_00;
  mapped_type *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *pmVar7;
  LogFinisher local_99;
  LogMessage local_98;
  mapped_type *local_60;
  mapped_type *local_58;
  mapped_type *local_50;
  mapped_type *local_48;
  uint64 local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_38;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  pmVar7 = &this->blobShapes;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](pmVar7,(key_type *)
                               ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](pmVar7,(key_type *)
                               ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  ShapeConstraint::setName
            (pmVar4,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_38 = pmVar7;
  if (specLayer->_oneof_case_[0] == 0x1ae) {
    LVar5 = specLayer->layer_;
  }
  else {
    LVar5.bidirectionallstm_ = Specification::BiDirectionalLSTMLayerParams::default_instance();
  }
  val = (LVar5.bidirectionallstm_)->inputvectorsize_;
  uVar1 = (LVar5.bidirectionallstm_)->outputvectorsize_;
  ShapeConstraint::upperBoundSequence(pmVar3,10000);
  ShapeConstraint::setChannel(pmVar3,val);
  ShapeConstraint::setHeight(pmVar3,1);
  ShapeConstraint::setWidth(pmVar3,1);
  local_40 = uVar1;
  ShapeConstraint::setChannel(pmVar4,uVar1 * 2);
  ShapeConstraint::setHeight(pmVar4,1);
  ShapeConstraint::setWidth(pmVar4,1);
  pmVar7 = local_38;
  pLVar6 = (LVar5.bidirectionallstm_)->params_;
  if (pLVar6 == (LSTMParams *)0x0) {
    pLVar6 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
  }
  if (pLVar6->sequenceoutput_ == true) {
    other = ShapeConstraint::sequenceRange(pmVar3);
    ShapeConstraint::updateSequenceRange(pmVar4,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar4,1);
  }
  if (4 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar7,*(key_type **)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar7,*(key_type **)
                                  ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    ShapeConstraint::setName
              (pmVar4,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    local_48 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](pmVar7,(key_type *)
                                   (specLayer->input_).super_RepeatedPtrFieldBase.rep_[1].elements
                                   [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    local_50 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](pmVar7,(key_type *)
                                   (specLayer->output_).super_RepeatedPtrFieldBase.rep_[1].elements
                                   [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    ShapeConstraint::setName
              (local_50,(string *)
                        (specLayer->output_).super_RepeatedPtrFieldBase.rep_[1].elements[0]);
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    local_58 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](pmVar7,*(key_type **)
                                    ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 2));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](pmVar7,*(key_type **)
                                   ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 2));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    ShapeConstraint::setName
              (this_00,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 2));
    local_60 = pmVar4;
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar7,(key_type *)
                                 (specLayer->input_).super_RepeatedPtrFieldBase.rep_[2].elements[0])
    ;
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](pmVar7,(key_type *)
                                  (specLayer->output_).super_RepeatedPtrFieldBase.rep_[2].elements
                                  [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar2 = google::protobuf::internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar2);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    ShapeConstraint::setName
              (this_01,(string *)(specLayer->output_).super_RepeatedPtrFieldBase.rep_[2].elements[0]
              );
    ShapeConstraint::setSequence(pmVar3,1);
    uVar1 = local_40;
    ShapeConstraint::setChannel(pmVar3,local_40);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    pmVar3 = local_48;
    ShapeConstraint::setSequence(local_48,1);
    ShapeConstraint::setChannel(pmVar3,uVar1);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    pmVar3 = local_60;
    ShapeConstraint::setSequence(local_60,1);
    ShapeConstraint::setChannel(pmVar3,uVar1);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    pmVar3 = local_50;
    ShapeConstraint::setSequence(local_50,1);
    ShapeConstraint::setChannel(pmVar3,uVar1);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    pmVar3 = local_58;
    ShapeConstraint::setSequence(local_58,1);
    ShapeConstraint::setChannel(pmVar3,uVar1);
    ShapeConstraint::setHeight(pmVar3,1);
    ShapeConstraint::setWidth(pmVar3,1);
    ShapeConstraint::setSequence(pmVar4,1);
    ShapeConstraint::setChannel(pmVar4,uVar1);
    ShapeConstraint::setHeight(pmVar4,1);
    ShapeConstraint::setWidth(pmVar4,1);
    ShapeConstraint::setSequence(this_00,1);
    ShapeConstraint::setChannel(this_00,uVar1);
    ShapeConstraint::setHeight(this_00,1);
    ShapeConstraint::setWidth(this_00,1);
    ShapeConstraint::setSequence(this_01,1);
    ShapeConstraint::setChannel(this_01,uVar1);
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBidirectionalLSTMLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::BiDirectionalLSTMLayerParams& recurrent = specLayer.bidirectionallstm();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    // This is the current maximum sequence length for bidirectional models.
    inputShape.upperBoundSequence(10000);
    
    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(2*outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.params().sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 5) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    ShapeConstraint& hiddenInShape = blobShapes[specLayer.input(2)];
    ShapeConstraint& hiddenOutShape = blobShapes[specLayer.output(2)];
    hiddenOutShape.setName(specLayer.output(2));

    ShapeConstraint& stateInShapeRev = blobShapes[specLayer.input(3)];
    ShapeConstraint& stateOutShapeRev = blobShapes[specLayer.output(3)];
    stateOutShapeRev.setName(specLayer.output(3));

    ShapeConstraint& hiddenInShapeRev = blobShapes[specLayer.input(4)];
    ShapeConstraint& hiddenOutShapeRev = blobShapes[specLayer.output(4)];
    hiddenOutShapeRev.setName(specLayer.output(4));


    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    hiddenInShape.setSequence(1);
    hiddenInShape.setChannel(outSize);
    hiddenInShape.setHeight(1);
    hiddenInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

    hiddenOutShape.setSequence(1);
    hiddenOutShape.setChannel(outSize);
    hiddenOutShape.setHeight(1);
    hiddenOutShape.setWidth(1);

    stateInShapeRev.setSequence(1);
    stateInShapeRev.setChannel(outSize);
    stateInShapeRev.setHeight(1);
    stateInShapeRev.setWidth(1);

    hiddenInShapeRev.setSequence(1);
    hiddenInShapeRev.setChannel(outSize);
    hiddenInShapeRev.setHeight(1);
    hiddenInShapeRev.setWidth(1);

    stateOutShapeRev.setSequence(1);
    stateOutShapeRev.setChannel(outSize);
    stateOutShapeRev.setHeight(1);
    stateOutShapeRev.setWidth(1);

    hiddenOutShapeRev.setSequence(1);
    hiddenOutShapeRev.setChannel(outSize);
    hiddenOutShapeRev.setHeight(1);
    hiddenOutShapeRev.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}